

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool comparesEqual(QUrlQuery *lhs,QUrlQuery *rhs)

{
  QUrlQueryPrivate *pQVar1;
  compare_eq_result_container<QList<pair<QString,_QString>_>,_std::pair<QString,_QString>_> cVar2;
  QUrlQueryPrivate *pQVar3;
  
  pQVar3 = (rhs->d).d.ptr;
  pQVar1 = (lhs->d).d.ptr;
  if (pQVar1 == pQVar3) {
    return true;
  }
  if (pQVar3 == (QUrlQueryPrivate *)0x0 || pQVar1 == (QUrlQueryPrivate *)0x0) {
    if (pQVar1 != (QUrlQueryPrivate *)0x0) {
      pQVar3 = pQVar1;
    }
    if (((pQVar3->valueDelimiter).ucs == L'=') && ((pQVar3->pairDelimiter).ucs == L'&')) {
      return (pQVar3->itemList).d.size == 0;
    }
  }
  else if (((pQVar1->valueDelimiter).ucs == (pQVar3->valueDelimiter).ucs) &&
          ((pQVar1->pairDelimiter).ucs == (pQVar3->pairDelimiter).ucs)) {
    cVar2 = QList<std::pair<QString,QString>>::operator==
                      ((QList<std::pair<QString,QString>> *)&pQVar1->itemList,&pQVar3->itemList);
    return cVar2;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }